

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

char replay_query_key(char *query,int *count)

{
  int iVar1;
  int local_2c;
  int n;
  int cnt;
  char *token;
  int *piStack_18;
  int key;
  int *count_local;
  char *query_local;
  
  piStack_18 = count;
  count_local = (int *)query;
  _n = next_log_token();
  local_2c = -1;
  iVar1 = __isoc99_sscanf(_n,"k:%x:%x",(long)&token + 4,&local_2c);
  if (iVar1 < 1) {
    parse_error("Bad query_key data");
  }
  if (piStack_18 != (int *)0x0) {
    *piStack_18 = local_2c;
  }
  return token._4_1_;
}

Assistant:

static char replay_query_key(const char *query, int *count)
{
    int key;
    char *token = next_log_token();
    int cnt = -1, n;
    
    n = sscanf(token, "k:%x:%x", &key, &cnt);
    if (n < 1)
	parse_error("Bad query_key data");
    
    if (count)
	*count = cnt;

    return key;
}